

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int tree_5_3::layorOrder(Btree t)

{
  code *pcVar1;
  ostream *this;
  int local_d0;
  int local_cc;
  int r;
  int f;
  Btree q [22];
  Btree p;
  Btree t_local;
  
  q[0x15] = t;
  if (t != (Btree)0x0) {
    _r = t;
    local_cc = -1;
    local_d0 = 0;
    while (local_cc < local_d0) {
      local_cc = local_cc + 1;
      q[0x15] = *(Btree *)(&r + (long)local_cc * 2);
      printf("%c\t",(ulong)(uint)q[0x15]->data);
      if (q[0x15]->left != (node *)0x0) {
        local_d0 = local_d0 + 1;
        *(node **)(&r + (long)local_d0 * 2) = q[0x15]->left;
      }
      if (q[0x15]->right != (node *)0x0) {
        local_d0 = local_d0 + 1;
        *(node **)(&r + (long)local_d0 * 2) = q[0x15]->right;
      }
    }
  }
  this = std::operator<<((ostream *)&std::cout,"");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int layorOrder(Btree t) {
        Btree p = t, q[22];
        int f, r;
        if (p != nullptr) {
            q[0] = p;
            f = -1;
            r = 0;
            while (f < r) {
                p = q[++f];
                printf("%c\t", p->data);
                if (p->left != nullptr)
                    q[++r] = p->left;
                if (p->right != nullptr)
                    q[++r] = p->right;
            }
        }
        std::cout << "" << std::endl;
    }